

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.capnp.h
# Opt level: O2

Builder * __thiscall
capnp::schema::Brand::Binding::Builder::initType(Builder *__return_storage_ptr__,Builder *this)

{
  PointerBuilder local_28;
  
  *(undefined2 *)(this->_builder).data = 1;
  local_28.pointer = (this->_builder).pointers;
  local_28.segment = (this->_builder).segment;
  local_28.capTable = (this->_builder).capTable;
  capnp::_::PointerBuilder::initStruct
            (&__return_storage_ptr__->_builder,&local_28,(StructSize)0x10003);
  return __return_storage_ptr__;
}

Assistant:

inline  ::capnp::schema::Type::Builder Brand::Binding::Builder::initType() {
  _builder.setDataField<Brand::Binding::Which>(
      ::capnp::bounded<0>() * ::capnp::ELEMENTS, Brand::Binding::TYPE);
  return ::capnp::_::PointerHelpers< ::capnp::schema::Type>::init(_builder.getPointerField(
      ::capnp::bounded<0>() * ::capnp::POINTERS));
}